

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

result<sockpp::none> * __thiscall
sockpp::socket::get_option
          (result<sockpp::none> *__return_storage_ptr__,socket *this,int level,int optname,
          void *optval,socklen_t *optlen)

{
  bool bVar1;
  uint uVar2;
  error_code *peVar3;
  int ret;
  error_code local_70;
  undefined1 local_60 [16];
  error_category *local_50;
  undefined1 auStack_48 [8];
  result<int> res;
  socklen_t *optlen_local;
  void *optval_local;
  int optname_local;
  int level_local;
  socket *this_local;
  
  result<int>::result((result<int> *)auStack_48);
  uVar2 = getsockopt(this->handle_,level,optname,optval,optlen);
  check_res<int,int>((result<int> *)local_60,(socket *)(ulong)uVar2,ret);
  res.err_._0_8_ = local_50;
  auStack_48 = (undefined1  [8])local_60._0_8_;
  res._0_8_ = local_60._8_8_;
  bVar1 = sockpp::result::operator_cast_to_bool((result *)auStack_48);
  if (bVar1) {
    std::error_code::error_code(&local_70);
  }
  else {
    peVar3 = result<int>::error((result<int> *)auStack_48);
    local_70._M_value = peVar3->_M_value;
    local_70._4_4_ = *(undefined4 *)&peVar3->field_0x4;
    local_70._M_cat = peVar3->_M_cat;
  }
  result<sockpp::none>::result(__return_storage_ptr__,&local_70);
  return __return_storage_ptr__;
}

Assistant:

result<> socket::get_option(
    int level, int optname, void* optval, socklen_t* optlen
) const noexcept {
    result<int> res;
#if defined(_WIN32)
    if (optval && optlen) {
        int len = static_cast<int>(*optlen);
        res = check_res(
            ::getsockopt(handle_, level, optname, static_cast<char*>(optval), &len)
        );
        if (res) {
            *optlen = static_cast<socklen_t>(len);
        }
    }
#else
    res = check_res(::getsockopt(handle_, level, optname, optval, optlen));
#endif
    return (res) ? error_code{} : res.error();
}